

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,uint32_t num_direct_distance_codes,
               uint32_t distance_postfix_bits,ContextType literal_context_mode,Command *commands,
               size_t n_commands,MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  HuffmanTree *tree;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  HistogramLiteral *histogram;
  ulong uVar20;
  size_t j;
  size_t sVar21;
  HistogramCommand *histogram_00;
  HistogramDistance *histogram_01;
  BlockEncoder distance_enc;
  BlockEncoder local_b58;
  BlockEncoder local_7a0;
  BlockEncoder local_3e8;
  
  uVar18 = (ulong)prev_byte;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  local_7a0.block_types_ = (mb->literal_split).types;
  local_7a0.block_lengths_ = (mb->literal_split).lengths;
  local_7a0.num_block_types_ = (mb->literal_split).num_types;
  local_7a0.num_blocks_ = (mb->literal_split).num_blocks;
  local_7a0.alphabet_size_ = 0x100;
  local_7a0.block_split_code_.type_code_calculator.last_type = 1;
  local_7a0.block_len_ = 0;
  local_7a0.block_split_code_.type_code_calculator.second_last_type = 0;
  local_7a0.block_ix_ = 0;
  if (local_7a0.num_blocks_ != 0) {
    local_7a0.block_len_ = (size_t)*local_7a0.block_lengths_;
  }
  local_7a0.entropy_ix_ = 0;
  local_7a0.depths_ = (uint8_t *)0x0;
  local_b58.block_len_ = 0;
  local_7a0.bits_ = (uint16_t *)0x0;
  local_b58.block_types_ = (mb->command_split).types;
  local_b58.block_lengths_ = (mb->command_split).lengths;
  local_b58.num_block_types_ = (mb->command_split).num_types;
  local_b58.num_blocks_ = (mb->command_split).num_blocks;
  local_b58.alphabet_size_ = 0x2c0;
  local_b58.block_split_code_.type_code_calculator.last_type = 1;
  local_b58.block_split_code_.type_code_calculator.second_last_type = 0;
  local_b58.block_ix_ = 0;
  if (local_b58.num_blocks_ != 0) {
    local_b58.block_len_ = (size_t)*local_b58.block_lengths_;
  }
  local_b58.entropy_ix_ = 0;
  local_b58.depths_ = (uint8_t *)0x0;
  local_3e8.block_len_ = 0;
  local_b58.bits_ = (uint16_t *)0x0;
  local_3e8.block_types_ = (mb->distance_split).types;
  local_3e8.block_lengths_ = (mb->distance_split).lengths;
  local_3e8.num_block_types_ = (mb->distance_split).num_types;
  local_3e8.num_blocks_ = (mb->distance_split).num_blocks;
  local_3e8.block_split_code_.type_code_calculator.last_type = 1;
  local_3e8.block_split_code_.type_code_calculator.second_last_type = 0;
  local_3e8.block_ix_ = 0;
  if (local_3e8.num_blocks_ != 0) {
    local_3e8.block_len_ = (size_t)*local_3e8.block_lengths_;
  }
  local_3e8.entropy_ix_ = 0;
  local_3e8.depths_ = (uint8_t *)0x0;
  local_3e8.bits_ = (uint16_t *)0x0;
  local_3e8.alphabet_size_ =
       (ulong)(num_direct_distance_codes + (0x30 << ((byte)distance_postfix_bits & 0x1f)) + 0x10);
  BuildAndStoreBlockSwitchEntropyCodes(&local_7a0,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&local_b58,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&local_3e8,tree,storage_ix,storage);
  if (distance_postfix_bits < 4) {
    uVar10 = *storage_ix;
    *(ulong *)(storage + (uVar10 >> 3)) =
         (ulong)distance_postfix_bits << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
    uVar7 = uVar10 + 2;
    *storage_ix = uVar7;
    uVar15 = num_direct_distance_codes >> ((byte)distance_postfix_bits & 0x1f);
    if (uVar15 < 0x10) {
      *(ulong *)(storage + (uVar7 >> 3)) =
           (ulong)uVar15 << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
      uVar10 = uVar10 + 6;
      *storage_ix = uVar10;
      if ((mb->literal_split).num_types != 0) {
        uVar7 = 0;
        do {
          if (CONTEXT_SIGNED < literal_context_mode) goto LAB_00117a30;
          *(ulong *)(storage + (uVar10 >> 3)) =
               (ulong)literal_context_mode << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
          uVar10 = uVar10 + 2;
          *storage_ix = uVar10;
          uVar7 = uVar7 + 1;
        } while (uVar7 < (mb->literal_split).num_types);
      }
      if (mb->literal_context_map_size == 0) {
        StoreTrivialContextMap(mb->literal_histograms_size,6,tree,storage_ix,storage);
      }
      else {
        EncodeContextMap(m,mb->literal_context_map,mb->literal_context_map_size,
                         mb->literal_histograms_size,tree,storage_ix,storage);
      }
      if (mb->distance_context_map_size == 0) {
        StoreTrivialContextMap(mb->distance_histograms_size,2,tree,storage_ix,storage);
      }
      else {
        EncodeContextMap(m,mb->distance_context_map,mb->distance_context_map_size,
                         mb->distance_histograms_size,tree,storage_ix,storage);
      }
      sVar11 = local_7a0.alphabet_size_;
      histogram = mb->literal_histograms;
      sVar21 = mb->literal_histograms_size;
      sVar13 = local_7a0.alphabet_size_ * sVar21;
      if (sVar13 == 0) {
        local_7a0.depths_ = (uint8_t *)0x0;
        local_7a0.bits_ = (uint16_t *)0x0;
      }
      else {
        local_7a0.depths_ = (uint8_t *)BrotliAllocate(m,sVar13);
        local_7a0.bits_ = (uint16_t *)BrotliAllocate(m,sVar13 * 2);
      }
      if (sVar21 != 0) {
        lVar14 = 0;
        lVar12 = 0;
        do {
          BuildAndStoreHuffmanTree
                    (histogram->data_,sVar11,tree,local_7a0.depths_ + lVar14,
                     (uint16_t *)((long)local_7a0.bits_ + lVar12),storage_ix,storage);
          histogram = histogram + 1;
          lVar12 = lVar12 + sVar11 * 2;
          lVar14 = lVar14 + sVar11;
          sVar21 = sVar21 - 1;
        } while (sVar21 != 0);
      }
      sVar11 = local_b58.alphabet_size_;
      histogram_00 = mb->command_histograms;
      sVar21 = mb->command_histograms_size;
      sVar13 = local_b58.alphabet_size_ * sVar21;
      if (sVar13 == 0) {
        local_b58.depths_ = (uint8_t *)0x0;
        local_b58.bits_ = (uint16_t *)0x0;
      }
      else {
        local_b58.depths_ = (uint8_t *)BrotliAllocate(m,sVar13);
        local_b58.bits_ = (uint16_t *)BrotliAllocate(m,sVar13 * 2);
      }
      if (sVar21 != 0) {
        lVar14 = 0;
        lVar12 = 0;
        do {
          BuildAndStoreHuffmanTree
                    (histogram_00->data_,sVar11,tree,local_b58.depths_ + lVar14,
                     (uint16_t *)((long)local_b58.bits_ + lVar12),storage_ix,storage);
          histogram_00 = histogram_00 + 1;
          lVar12 = lVar12 + sVar11 * 2;
          lVar14 = lVar14 + sVar11;
          sVar21 = sVar21 - 1;
        } while (sVar21 != 0);
      }
      sVar11 = local_3e8.alphabet_size_;
      histogram_01 = mb->distance_histograms;
      sVar21 = mb->distance_histograms_size;
      sVar13 = local_3e8.alphabet_size_ * sVar21;
      if (sVar13 == 0) {
        local_3e8.depths_ = (uint8_t *)0x0;
        local_3e8.bits_ = (uint16_t *)0x0;
      }
      else {
        local_3e8.depths_ = (uint8_t *)BrotliAllocate(m,sVar13);
        local_3e8.bits_ = (uint16_t *)BrotliAllocate(m,sVar13 * 2);
      }
      if (sVar21 != 0) {
        lVar14 = 0;
        lVar12 = 0;
        do {
          BuildAndStoreHuffmanTree
                    (histogram_01->data_,sVar11,tree,local_3e8.depths_ + lVar14,
                     (uint16_t *)((long)local_3e8.bits_ + lVar12),storage_ix,storage);
          histogram_01 = histogram_01 + 1;
          lVar12 = lVar12 + sVar11 * 2;
          lVar14 = lVar14 + sVar11;
          sVar21 = sVar21 - 1;
        } while (sVar21 != 0);
      }
      BrotliFree(m,tree);
      if (n_commands != 0) {
        uVar7 = (ulong)prev_byte2;
        sVar21 = 0;
        do {
          uVar15 = commands[sVar21].insert_len_;
          uVar10 = (ulong)uVar15;
          uVar19 = commands[sVar21].copy_len_;
          uVar3 = commands[sVar21].dist_extra_;
          uVar1 = commands[sVar21].cmd_prefix_;
          uVar2 = commands[sVar21].dist_prefix_;
          StoreSymbol(&local_b58,(ulong)uVar1,storage_ix,storage);
          uVar9 = uVar15;
          if (5 < uVar10) {
            if (uVar15 < 0x82) {
              uVar9 = 0x1f;
              uVar5 = (uint)(uVar10 - 2);
              if (uVar5 != 0) {
                for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              iVar8 = (uVar9 ^ 0xffffffe0) + 0x1f;
              uVar9 = (int)(uVar10 - 2 >> ((byte)iVar8 & 0x3f)) + iVar8 * 2 + 2;
            }
            else if (uVar15 < 0x842) {
              uVar9 = 0x1f;
              if (uVar15 - 0x42 != 0) {
                for (; uVar15 - 0x42 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = (uVar9 ^ 0xffffffe0) + 0x2a;
            }
            else {
              uVar9 = 0x15;
              if (0x1841 < uVar15) {
                uVar9 = 0x17 - (uVar15 < 0x5842);
              }
            }
          }
          uVar5 = uVar19 & 0xffffff;
          uVar19 = uVar19 >> 0x18 ^ uVar5;
          if (uVar19 < 10) {
            uVar16 = uVar19 + 0xfffe;
          }
          else if (uVar19 < 0x86) {
            uVar16 = 0x1f;
            uVar6 = (uint)((ulong)uVar19 - 6);
            if (uVar6 != 0) {
              for (; uVar6 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            iVar8 = (uVar16 ^ 0xffffffe0) + 0x1f;
            uVar16 = (int)((ulong)uVar19 - 6 >> ((byte)iVar8 & 0x3f)) + iVar8 * 2 + 4;
          }
          else {
            uVar16 = 0x17;
            if (uVar19 < 0x846) {
              uVar16 = 0x1f;
              if (uVar19 - 0x46 != 0) {
                for (; uVar19 - 0x46 >> uVar16 == 0; uVar16 = uVar16 - 1) {
                }
              }
              uVar16 = (uVar16 ^ 0xffffffe0) + 0x2c;
            }
          }
          uVar20 = (ulong)((uVar9 & 0xffff) << 2);
          iVar8 = *(int *)((long)kInsExtra + uVar20);
          uVar17 = (ulong)((uVar16 & 0xffff) << 2);
          uVar20 = (ulong)(uVar19 - *(int *)((long)kCopyBase + uVar17)) << ((byte)iVar8 & 0x3f) |
                   (ulong)(uVar15 - *(int *)((long)kInsBase + uVar20));
          uVar19 = iVar8 + *(int *)((long)kCopyExtra + uVar17);
          if (uVar20 >> ((byte)uVar19 & 0x3f) != 0) goto LAB_00117a30;
          if (0x38 < uVar19) {
LAB_00117a4f:
            __assert_fail("n_bits <= 56",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                          ,0x37,
                          "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                         );
          }
          uVar17 = *storage_ix;
          *(ulong *)(storage + (uVar17 >> 3)) =
               uVar20 << ((byte)uVar17 & 7) | (ulong)storage[uVar17 >> 3];
          *storage_ix = uVar19 + uVar17;
          if (mb->literal_context_map_size == 0) {
            if (uVar15 != 0) {
              do {
                StoreSymbol(&local_7a0,(ulong)input[start_pos & mask],storage_ix,storage);
                start_pos = start_pos + 1;
                uVar10 = uVar10 - 1;
              } while (uVar10 != 0);
            }
          }
          else {
            uVar20 = uVar7;
            if (uVar15 != 0) {
              do {
                uVar7 = uVar18;
                switch(literal_context_mode) {
                case CONTEXT_LSB6:
                  bVar4 = (byte)uVar7 & 0x3f;
                  break;
                case CONTEXT_MSB6:
                  bVar4 = (byte)(uVar7 >> 2);
                  break;
                case CONTEXT_UTF8:
                  bVar4 = ""[uVar20 + 0x100] | ""[uVar7];
                  break;
                case CONTEXT_SIGNED:
                  bVar4 = ""[uVar7] * '\b' + ""[uVar20];
                  break;
                default:
                  bVar4 = 0;
                }
                uVar18 = (ulong)input[start_pos & mask];
                StoreSymbolWithContext
                          (&local_7a0,(ulong)input[start_pos & mask],(ulong)bVar4,
                           mb->literal_context_map,storage_ix,storage,6);
                start_pos = start_pos + 1;
                uVar10 = uVar10 - 1;
                uVar20 = uVar7;
              } while (uVar10 != 0);
            }
          }
          start_pos = start_pos + uVar5;
          if (uVar5 != 0) {
            uVar7 = (ulong)input[start_pos - 2 & mask];
            uVar18 = (ulong)input[start_pos - 1 & mask];
            if (0x7f < uVar1) {
              if (mb->distance_context_map_size == 0) {
                StoreSymbol(&local_3e8,(ulong)uVar2,storage_ix,storage);
              }
              else {
                uVar15 = uVar1 & 7;
                if (2 < uVar15) {
                  uVar15 = 3;
                }
                sVar11 = 3;
                if (((uVar1 >> 6) - 2 & 0xfffffffd) == 0) {
                  sVar11 = (ulong)uVar15;
                }
                if (uVar1 >> 6 == 7) {
                  sVar11 = (ulong)uVar15;
                }
                StoreSymbolWithContext
                          (&local_3e8,(ulong)uVar2,sVar11,mb->distance_context_map,storage_ix,
                           storage,2);
              }
              if ((uVar3 & 0xffffff) >> ((byte)(uVar3 >> 0x18) & 0x3f) != 0) goto LAB_00117a30;
              if (0x38ffffff < uVar3) goto LAB_00117a4f;
              uVar10 = *storage_ix;
              *(ulong *)(storage + (uVar10 >> 3)) =
                   (ulong)(uVar3 & 0xffffff) << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
              *storage_ix = (uVar3 >> 0x18) + uVar10;
            }
          }
          sVar21 = sVar21 + 1;
        } while (sVar21 != n_commands);
      }
      BrotliFree(m,local_3e8.depths_);
      local_3e8.depths_ = (uint8_t *)0x0;
      BrotliFree(m,local_3e8.bits_);
      local_3e8.bits_ = (uint16_t *)0x0;
      BrotliFree(m,local_b58.depths_);
      local_b58.depths_ = (uint8_t *)0x0;
      BrotliFree(m,local_b58.bits_);
      local_b58.bits_ = (uint16_t *)0x0;
      BrotliFree(m,local_7a0.depths_);
      local_7a0.depths_ = (uint8_t *)0x0;
      BrotliFree(m,local_7a0.bits_);
      if (is_last != 0) {
        uVar15 = (int)*storage_ix + 7;
        *storage_ix = (ulong)(uVar15 & 0xfffffff8);
        storage[uVar15 >> 3] = '\0';
      }
      return;
    }
  }
LAB_00117a30:
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,0x36,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
  ;
}

Assistant:

void BrotliStoreMetaBlock(MemoryManager* m,
                          const uint8_t* input,
                          size_t start_pos,
                          size_t length,
                          size_t mask,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          BROTLI_BOOL is_last,
                          uint32_t num_direct_distance_codes,
                          uint32_t distance_postfix_bits,
                          ContextType literal_context_mode,
                          const Command *commands,
                          size_t n_commands,
                          const MetaBlockSplit* mb,
                          size_t *storage_ix,
                          uint8_t *storage) {
  size_t pos = start_pos;
  size_t i;
  size_t num_distance_codes =
      BROTLI_NUM_DISTANCE_SHORT_CODES + num_direct_distance_codes +
      (48u << distance_postfix_bits);
  HuffmanTree* tree;
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  InitBlockEncoder(&literal_enc, 256, mb->literal_split.num_types,
      mb->literal_split.types, mb->literal_split.lengths,
      mb->literal_split.num_blocks);
  InitBlockEncoder(&command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(&distance_enc, num_distance_codes,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(
      &distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(4, num_direct_distance_codes >> distance_postfix_bits,
                  storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, &literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, &command_enc, mb->command_histograms,
      mb->command_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, &distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(&command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(&literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context = Context(prev_byte, prev_byte2, literal_context_mode);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(&literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_;
        uint32_t distnumextra = cmd.dist_extra_ >> 24;
        uint64_t distextra = cmd.dist_extra_ & 0xffffff;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(&distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(&distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, &distance_enc);
  CleanupBlockEncoder(m, &command_enc);
  CleanupBlockEncoder(m, &literal_enc);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}